

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::GoniometricLight::Scale(GoniometricLight *this,Vector3f wl,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  int c;
  WrapMode2D *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  SampledSpectrum SVar12;
  Point2f st;
  Float phi;
  Float theta;
  float in_stack_ffffffffffffff58;
  Float in_stack_ffffffffffffff5c;
  SampledSpectrum *this_00;
  WrapMode w;
  SampledWavelengths *in_stack_ffffffffffffff78;
  Image *in_stack_ffffffffffffff80;
  Tuple2<pbrt::Point2,_float> p;
  array<pbrt::WrapMode,_2> local_50;
  SampledSpectrum local_20 [2];
  undefined1 auVar11 [56];
  
  local_20[0].values.values._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = local_20;
  SphericalTheta((Vector3f *)0x704657);
  SphericalPhi((Vector3f *)this_00);
  auVar11 = (undefined1  [56])0x0;
  Point2<float>::Point2
            ((Point2<float> *)this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  w = in_RDI[0x18].wrap.values[0];
  auVar7 = (undefined1  [56])0x0;
  SVar12 = DenselySampledSpectrum::Sample
                     ((DenselySampledSpectrum *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  auVar8._0_8_ = SVar12.values.values._8_8_;
  auVar8._8_56_ = auVar11;
  auVar4._0_8_ = SVar12.values.values._0_8_;
  auVar4._8_56_ = auVar7;
  auVar7 = (undefined1  [56])0x0;
  p = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar8._0_16_);
  SVar12 = pbrt::operator*((Float)((ulong)this_00 >> 0x20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  auVar9._0_8_ = SVar12.values.values._8_8_;
  auVar9._8_56_ = auVar11;
  auVar5._0_8_ = SVar12.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar9._0_16_);
  c = (int)((ulong)(in_RDI + 0x19) >> 0x20);
  WrapMode2D::WrapMode2D(in_RDI,w);
  Image::LookupNearestChannel(in_stack_ffffffffffffff80,(Point2f)p,c,(WrapMode2D)local_50.values);
  auVar7 = extraout_var;
  SVar12 = SampledSpectrum::operator*(this_00,in_stack_ffffffffffffff5c);
  auVar10._0_8_ = SVar12.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar6._0_8_ = SVar12.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  uVar2 = vmovlpd_avx(auVar10._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

Scale(Vector3f wl, const SampledWavelengths &lambda) const {
        Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
        Point2f st(phi * Inv2Pi, theta * InvPi);
        return scale * I.Sample(lambda) * image.LookupNearestChannel(st, 0);
    }